

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,SearchStatistics *statistics)

{
  ostream *poVar1;
  
  std::operator<<(os,"Initial bounds: (");
  poVar1 = std::ostream::_M_insert<double>(statistics->initial_lb);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(statistics->initial_ub);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(os,"Final bounds: (");
  poVar1 = std::ostream::_M_insert<double>(statistics->final_lb);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(statistics->final_ub);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(os,"Time (CPU s): path / expansion / backup / total = ");
  poVar1 = std::ostream::_M_insert<double>(statistics->time_path);
  std::operator<<(poVar1," / ");
  poVar1 = std::ostream::_M_insert<double>(statistics->time_node_expansion);
  std::operator<<(poVar1," / ");
  poVar1 = std::ostream::_M_insert<double>(statistics->time_backup);
  std::operator<<(poVar1," / ");
  poVar1 = std::ostream::_M_insert<double>(statistics->time_search);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"Trials: no. / max length = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_trials);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->longest_trial_length);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"# nodes: expanded / total / policy = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_expanded_nodes);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_tree_nodes);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_policy_nodes);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"# particles: initial / final / tree = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_particles_before_search);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_particles_after_search);
  poVar1 = std::operator<<(poVar1," / ");
  std::ostream::operator<<(poVar1,statistics->num_tree_particles);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const SearchStatistics& statistics) {
	os << "Initial bounds: (" << statistics.initial_lb << ", "
		<< statistics.initial_ub << ")" << endl;
	os << "Final bounds: (" << statistics.final_lb << ", "
		<< statistics.final_ub << ")" << endl;
	os << "Time (CPU s): path / expansion / backup / total = "
		<< statistics.time_path << " / " << statistics.time_node_expansion
		<< " / " << statistics.time_backup << " / " << statistics.time_search
		<< endl;
	os << "Trials: no. / max length = " << statistics.num_trials << " / "
		<< statistics.longest_trial_length << endl;
	os << "# nodes: expanded / total / policy = "
		<< statistics.num_expanded_nodes << " / " << statistics.num_tree_nodes
		<< " / " << statistics.num_policy_nodes << endl;
	os << "# particles: initial / final / tree = "
		<< statistics.num_particles_before_search << " / "
		<< statistics.num_particles_after_search << " / "
		<< statistics.num_tree_particles; // << endl;
	return os;
}